

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

void __thiscall
caffe::EltwiseParameter::set_operation(EltwiseParameter *this,EltwiseParameter_EltwiseOp value)

{
  if (value < (EltwiseParameter_EltwiseOp_MAX|EltwiseParameter_EltwiseOp_SUM)) {
    *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
    this->operation_ = value;
    return;
  }
  __assert_fail("::caffe::EltwiseParameter_EltwiseOp_IsValid(value)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/include/caffe/proto/caffe.pb.h"
                ,0x49f9,
                "void caffe::EltwiseParameter::set_operation(::caffe::EltwiseParameter_EltwiseOp)");
}

Assistant:

bool EltwiseParameter_EltwiseOp_IsValid(int value) {
  switch (value) {
    case 0:
    case 1:
    case 2:
      return true;
    default:
      return false;
  }
}